

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::Resize(SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
         *this)

{
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *pRVar1;
  int iVar2;
  code *pcVar3;
  Type pHVar4;
  int *ptr;
  int *ptr_00;
  undefined4 *puVar5;
  bool bVar6;
  uint uVar7;
  EntryType *ptr_01;
  WeakType *dst;
  ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *pVVar8;
  int iVar9;
  bool zeroAllocate;
  long lVar10;
  ulong uVar11;
  size_t dstCount;
  int *local_88;
  int *newBuckets;
  ulong local_78;
  undefined4 *local_70;
  WeakType *local_68;
  Type *local_60;
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *local_58;
  Type *local_50;
  Type *local_48;
  int local_3c;
  uint local_38;
  int modIndex;
  
  uVar7 = this->count * 2;
  local_3c = 0x4b;
  local_38 = DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>::GetBucketSize(uVar7,&local_3c);
  local_88 = (int *)0x0;
  newBuckets = (int *)0x0;
  local_68 = (RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)0x0;
  modIndex = uVar7;
  if (local_38 == this->bucketCount) {
    ptr_01 = AllocateEntries(this,uVar7,zeroAllocate);
    dst = AllocateWeakRefs(this,uVar7);
    dstCount = (size_t)(int)uVar7;
    local_48 = &this->entries;
    js_memcpy_s(ptr_01,dstCount * 8,(this->entries).ptr,(long)this->count << 3);
    if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_0145c43c) == 1) {
      (*g_verifyIsNotBarrierAddress)(ptr_01,dstCount);
    }
    Memory::
    CopyArray<Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol*>,Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol*>,Memory::Recycler>
              (dst,dstCount,&this->weakRefs,(long)this->count);
    Memory::
    WriteBarrierPtr<JsUtil::(anonymous_namespace)::ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>_>
    ::operator=(local_48,ptr_01);
    Memory::WriteBarrierPtr<Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*>_>::
    WriteBarrierSet(&this->weakRefs,dst);
    this->size = modIndex;
    this->modFunctionIndex = local_3c;
  }
  else {
    Allocate(this,&local_88,(EntryType **)&newBuckets,&local_68,local_38,uVar7);
    ptr_00 = newBuckets;
    ptr = local_88;
    this->modFunctionIndex = local_3c;
    this->count = 0;
    local_50 = &this->buckets;
    local_48 = &this->entries;
    local_60 = &this->weakRefs;
    local_58 = local_68;
    local_70 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    uVar11 = 0;
    while (uVar11 < this->bucketCount) {
      iVar9 = local_50->ptr[uVar11];
      local_78 = uVar11;
      if (-1 < iVar9) {
        for (; iVar9 != -1; iVar9 = pVVar8[iVar9].super_ValueEntryData<int>.next) {
          pVVar8 = local_48->ptr;
          if (pVVar8[iVar9].super_ValueEntryData<int>.next < -1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = local_70;
            *local_70 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                               ,0x245,"(false)",
                               "Following bucket chains should not result in free entries");
            if (!bVar6) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar5 = 0;
            break;
          }
          if (local_60->ptr[iVar9].ptr != (Type)0x0) {
            uVar7 = GetBucket(pVVar8[iVar9].super_ValueEntryData<int>.value * 2 + 1,local_38,
                              this->modFunctionIndex);
            lVar10 = (long)this->count;
            ptr_00[lVar10 * 2 + 1] = ptr[(int)uVar7];
            ptr_00[lVar10 * 2] = (this->entries).ptr[iVar9].super_ValueEntryData<int>.value;
            pRVar1 = (this->weakRefs).ptr + iVar9;
            pHVar4 = pRVar1->heapBlock;
            local_58[lVar10].ptr = pRVar1->ptr;
            local_58[lVar10].heapBlock = pHVar4;
            iVar2 = this->count;
            ptr[(int)uVar7] = iVar2;
            this->count = iVar2 + 1;
            pVVar8 = (this->entries).ptr;
          }
        }
      }
      uVar11 = local_78 + 1;
    }
    this->freeList = 0;
    this->freeCount = 0;
    Memory::WriteBarrierPtr<int>::WriteBarrierSet(local_50,ptr);
    Memory::
    WriteBarrierPtr<JsUtil::(anonymous_namespace)::ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>_>
    ::operator=(local_48,(ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *)
                         ptr_00);
    Memory::WriteBarrierPtr<Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*>_>::
    WriteBarrierSet(local_60,local_58);
    this->bucketCount = local_38;
    this->size = modIndex;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);
            __analysis_assert(count > 1);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            WeakType* newWeakRefs = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                newWeakRefs = AllocateWeakRefs(newSize);
                CopyArray<EntryType>(newEntries, newSize, entries, count);
                CopyArray<WeakType>(newWeakRefs, newSize, weakRefs, count); // TODO: concurrency issues?

                this->entries = newEntries;
                this->weakRefs = newWeakRefs;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, &newWeakRefs, newBucketCount, newSize);

            this->modFunctionIndex = modIndex;

            // Need to re-bucket the entries
            // Also need to account for whether the weak refs have been collected
            // Have to go in order so we can remove entries as appropriate
            this->count = 0;
            for (uint i = 0; i < this->bucketCount; ++i)
            {
                if (this->buckets[i] < 0)
                {
                    continue;
                }

                for (int currentEntry = this->buckets[i]; currentEntry != -1; )
                {
                    if (IsFreeEntry(entries[currentEntry]))
                    {
                        // Entry is free; this shouldn't happen, but stop following the chain
                        AssertMsg(false, "Following bucket chains should not result in free entries");
                        break;
                    }
                    if (this->weakRefs[currentEntry] == nullptr)
                    {
                        // The weak ref has been collected; don't bother bringing it to the new collection
                        currentEntry = this->entries[currentEntry].next;
                        continue;
                    }

                    hash_t hashCode = GetHashCodeWithKey<TBKey>(this->GetKey(currentEntry));
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[count].next = newBuckets[bucket];
                    newEntries[count].SetValue(this->entries[currentEntry].Value());
                    newWeakRefs[count] = this->weakRefs[currentEntry];
                    newBuckets[bucket] = count;
                    ++count;

                    currentEntry = this->entries[currentEntry].next;
                }
            }
            this->freeCount = 0;
            this->freeList = 0;
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->weakRefs = newWeakRefs;
            this->bucketCount = newBucketCount;
            this->size = newSize;

        }